

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardFileIterator.h
# Opt level: O0

ssize_t __thiscall
bwtil::BackwardFileIterator::read(BackwardFileIterator *this,int __fd,void *__buf,size_t __nbytes)

{
  symbol sVar1;
  size_t sVar2;
  ostream *poVar3;
  symbol s;
  
  sVar1 = this->buffer[this->ptr_in_buffer];
  if (this->ptr_in_buffer == 0) {
    if (this->offset == 0) {
      this->begin_of_file = true;
    }
    else {
      this->offset = this->offset - this->bufferSize;
      fseek((FILE *)this->fp,this->offset,0);
      sVar2 = fread(this->buffer,1,this->bufferSize,(FILE *)this->fp);
      if (sVar2 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Error while reading file ");
        poVar3 = std::operator<<(poVar3,(string *)&this->path);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
      this->ptr_in_buffer = this->bufferSize - 1;
    }
  }
  else {
    this->ptr_in_buffer = this->ptr_in_buffer - 1;
  }
  return CONCAT71((int7)((ulong)this >> 8),sVar1);
}

Assistant:

symbol read(){

		symbol s = buffer[ptr_in_buffer];

		if(ptr_in_buffer==0){//read new chunk

			if(offset==0){
				begin_of_file=true;
				return s;
			}

			offset -= bufferSize;

			fseek ( fp , offset , SEEK_SET );

			if(fread(buffer, sizeof(symbol), bufferSize, fp)==0){
				cout << "Error while reading file " << path <<endl;
				exit(0);
			}

			ptr_in_buffer = bufferSize-1;

		}else{
			ptr_in_buffer--;
		}

		return s;

	}